

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.cpp
# Opt level: O2

void __thiscall
btTriangleIndexVertexArray::getLockedReadOnlyVertexIndexBase
          (btTriangleIndexVertexArray *this,uchar **vertexbase,int *numverts,PHY_ScalarType *type,
          int *vertexStride,uchar **indexbase,int *indexstride,int *numfaces,
          PHY_ScalarType *indicestype,int subpart)

{
  btIndexedMesh *pbVar1;
  long lVar2;
  
  lVar2 = (long)subpart;
  pbVar1 = (this->m_indexedMeshes).m_data;
  *numverts = pbVar1[lVar2].m_numVertices;
  *vertexbase = pbVar1[lVar2].m_vertexBase;
  *type = pbVar1[lVar2].m_vertexType;
  *vertexStride = pbVar1[lVar2].m_vertexStride;
  *numfaces = pbVar1[lVar2].m_numTriangles;
  *indexbase = pbVar1[lVar2].m_triangleIndexBase;
  *indexstride = pbVar1[lVar2].m_triangleIndexStride;
  *indicestype = pbVar1[lVar2].m_indexType;
  return;
}

Assistant:

void	btTriangleIndexVertexArray::getLockedReadOnlyVertexIndexBase(const unsigned char **vertexbase, int& numverts,PHY_ScalarType& type, int& vertexStride,const unsigned char **indexbase,int & indexstride,int& numfaces,PHY_ScalarType& indicestype,int subpart) const
{
	const btIndexedMesh& mesh = m_indexedMeshes[subpart];

	numverts = mesh.m_numVertices;
	(*vertexbase) = (const unsigned char *)mesh.m_vertexBase;

   type = mesh.m_vertexType;
   
	vertexStride = mesh.m_vertexStride;

	numfaces = mesh.m_numTriangles;
	(*indexbase) = (const unsigned char *)mesh.m_triangleIndexBase;
	indexstride = mesh.m_triangleIndexStride;
	indicestype = mesh.m_indexType;
}